

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering_Equality.cpp
# Opt level: O2

Result __thiscall
Kernel::Ordering::compare_s1It1_s2It2
          (Ordering *this,TermList s1,TermList s2,TermList t1,TermList t2)

{
  Result RVar1;
  int iVar2;
  
  RVar1 = (*this->_vptr_Ordering[3])(this,s1._content,t2._content);
  if (RVar1 != INCOMPARABLE) {
    if (RVar1 == LESS) {
      iVar2 = (*this->_vptr_Ordering[3])(this,t1._content,s2._content);
      RVar1 = (uint)(iVar2 != 1) * 2 + LESS;
    }
    else {
      iVar2 = (*this->_vptr_Ordering[3])(this,s2._content,t1._content);
      RVar1 = (uint)(iVar2 != 1) * 3 + GREATER;
    }
  }
  return RVar1;
}

Assistant:

Ordering::Result Ordering::compare_s1It1_s2It2(TermList s1,TermList s2,TermList t1,TermList t2) const
{
  ASS_EQ(compare(s1,t1), INCOMPARABLE);
  ASS_EQ(compare(s2,t2), INCOMPARABLE);

  switch(compare(s1,t2)) {
  case GREATER:
    return compare_s1Gt1_s1It2_s2It1(s1,s2,t2,t1);
  case INCOMPARABLE:
    return INCOMPARABLE;
  case LESS:
    return reverse(compare_s1Gt1_s1It2_s2It1(t2,t1,s1,s2));
  default:
    ASSERTION_VIOLATION;
  }
}